

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O0

int json_pointer_set_with_array_cb
              (json_object **obj,char *path,json_object *value,
              json_pointer_array_set_cb array_set_cb,void *priv)

{
  int iVar1;
  int *piVar2;
  json_object *pjStack_50;
  int rc;
  json_object *set;
  char *path_copy;
  char *endp;
  void *priv_local;
  json_pointer_array_set_cb array_set_cb_local;
  json_object *value_local;
  char *path_local;
  json_object **obj_local;
  
  set = (json_object *)0x0;
  pjStack_50 = (json_object *)0x0;
  endp = (char *)priv;
  priv_local = array_set_cb;
  array_set_cb_local = (json_pointer_array_set_cb)value;
  value_local = (json_object *)path;
  path_local = (char *)obj;
  if ((obj == (json_object **)0x0) || (path == (char *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    obj_local._4_4_ = -1;
  }
  else if (*path == '\0') {
    json_object_put(*obj);
    *(json_pointer_array_set_cb *)path_local = array_set_cb_local;
    obj_local._4_4_ = 0;
  }
  else if (*path == '/') {
    path_copy = strrchr(path,0x2f);
    if ((json_object *)path_copy == value_local) {
      value_local = (json_object *)((long)&value_local->o_type + 1);
      obj_local._4_4_ =
           json_pointer_set_single_path
                     (*(json_object **)path_local,(char *)value_local,
                      (json_object *)array_set_cb_local,(json_pointer_array_set_cb)priv_local,endp);
    }
    else {
      set = (json_object *)strdup((char *)value_local);
      if (set == (json_object *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0xc;
        obj_local._4_4_ = -1;
      }
      else {
        *(char *)((long)set + ((long)path_copy - (long)value_local)) = '\0';
        iVar1 = json_pointer_object_get_recursive
                          (*(json_object **)path_local,(char *)set,&stack0xffffffffffffffb0);
        free(set);
        obj_local._4_4_ = iVar1;
        if (iVar1 == 0) {
          path_copy = path_copy + 1;
          obj_local._4_4_ =
               json_pointer_set_single_path
                         (pjStack_50,path_copy,(json_object *)array_set_cb_local,
                          (json_pointer_array_set_cb)priv_local,endp);
        }
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    obj_local._4_4_ = -1;
  }
  return obj_local._4_4_;
}

Assistant:

int json_pointer_set_with_array_cb(struct json_object **obj, const char *path,
				   struct json_object *value,
				   json_pointer_array_set_cb array_set_cb, void *priv)
{
	const char *endp;
	char *path_copy = NULL;
	struct json_object *set = NULL;
	int rc;

	if (!obj || !path)
	{
		errno = EINVAL;
		return -1;
	}

	if (path[0] == '\0')
	{
		json_object_put(*obj);
		*obj = value;
		return 0;
	}

	if (path[0] != '/')
	{
		errno = EINVAL;
		return -1;
	}

	/* If there's only 1 level to set, stop here */
	if ((endp = strrchr(path, '/')) == path)
	{
		path++;
		return json_pointer_set_single_path(*obj, path, value, array_set_cb, priv);
	}

	/* pass a working copy to the recursive call */
	if (!(path_copy = strdup(path)))
	{
		errno = ENOMEM;
		return -1;
	}
	path_copy[endp - path] = '\0';
	rc = json_pointer_object_get_recursive(*obj, path_copy, &set);
	free(path_copy);

	if (rc)
		return rc;

	endp++;
	return json_pointer_set_single_path(set, endp, value, array_set_cb, priv);
}